

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecatDemoCommon.cpp
# Opt level: O1

EC_T_DWORD
DoBusScan(EC_T_DWORD dwInstanceID,CAtEmLogging *poLog,EC_T_SB_STATUS_NTFY_DESC *poStatus,
         EC_T_BOOL bWait,EC_T_BOOL bNtfyActive,EC_T_DWORD dwScanBustimeout)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  EC_T_DWORD dwNumOutData;
  EC_T_IOCTLPARMS oIoCtlParms;
  CEcTimer oTimeout;
  EC_T_DWORD local_80;
  undefined1 local_7c [4];
  CAtEmLogging *local_78;
  EC_T_DWORD *local_70;
  undefined4 local_68;
  EC_T_SB_STATUS_NTFY_DESC *local_64;
  undefined4 local_5c;
  undefined1 *local_58;
  CEcTimer local_50 [32];
  
  local_80 = dwScanBustimeout;
  CEcTimer::CEcTimer(local_50);
  local_68 = 4;
  local_64 = (EC_T_SB_STATUS_NTFY_DESC *)0x0;
  local_5c = 0;
  local_58 = local_7c;
  local_70 = &local_80;
  uVar2 = emIoControl(dwInstanceID,0x50007);
  if (uVar2 == 0) {
    local_78 = poLog;
    CEcTimer::Start(local_50,local_80);
    iVar3 = CEcTimer::IsElapsed(local_50);
    uVar4 = 0;
    if (iVar3 == 0) {
      bVar1 = false;
      do {
        uVar4 = emIoControl(dwInstanceID,0x50001,0);
        if (uVar4 == 0x98110008) {
          LinuxSleep(10);
          uVar4 = 0x98110008;
        }
        else {
          if (uVar4 != 0) {
            CAtEmLogging::LogError
                      (local_78,"DoBusScan(): Error 0x%x when restarting bus scan",(ulong)uVar4);
            break;
          }
          iVar3 = CEcTimer::IsElapsed(local_50);
          uVar4 = 0;
          while (iVar3 == 0) {
            LinuxSleep(10);
            local_70 = (EC_T_DWORD *)0x0;
            local_68 = 0;
            local_5c = 8;
            local_58 = local_7c;
            local_64 = poStatus;
            uVar4 = emIoControl(dwInstanceID,0x50002,&local_70);
            if (uVar4 != 0) {
              CAtEmLogging::LogError
                        (local_78,"DoBusScan(): Error 0x%x getting the Bus scan status",(ulong)uVar4
                        );
              break;
            }
            uVar4 = poStatus->dwResultCode;
            if ((bWait == 0) || (uVar4 + 0x67eefff7 < 0xfffffffe)) {
              bVar1 = true;
              break;
            }
            iVar3 = CEcTimer::IsElapsed(local_50);
          }
        }
        iVar3 = CEcTimer::IsElapsed(local_50);
      } while (iVar3 == 0 && !bVar1);
    }
    iVar3 = CEcTimer::IsElapsed(local_50);
    uVar2 = 0x98110010;
    if (iVar3 == 0) {
      uVar2 = uVar4;
    }
  }
  else {
    CAtEmLogging::LogError
              (poLog,"Scan Bus feature could not be enabled! (Result = 0x%x)",(ulong)uVar2);
  }
  return uVar2;
}

Assistant:

EC_T_DWORD DoBusScan
    (EC_T_DWORD                dwInstanceID
    ,CAtEmLogging*             poLog
    ,EC_T_SB_STATUS_NTFY_DESC* poStatus           /**< [out]  bus scan status */
    ,EC_T_BOOL                 bWait              /**< [in]   EC_TRUE if call shall block until the scan is finish */
    ,EC_T_BOOL                 bNtfyActive        /**< [in]   EC_TRUE if notifications are active */
    ,EC_T_DWORD                dwScanBustimeout)  /**< [in]   Timeout value in msec */
{
    EC_T_DWORD dwRes = EC_E_NOERROR;
    CEcTimer   oTimeout;
    EC_T_BOOL  bReady = EC_FALSE;

    EC_UNREFPARM(bNtfyActive);

    /* set timeout */
    dwRes = emIoCtl(dwInstanceID, EC_IOCTL_SB_ENABLE, &dwScanBustimeout, sizeof(EC_T_DWORD), EC_NULL, 0, EC_NULL);
    if (EC_E_NOERROR != dwRes)
    {
        LogErr( "Scan Bus feature could not be enabled! (Result = 0x%x)", dwRes);
        goto Exit;
    }

    oTimeout.Start(dwScanBustimeout);
    while (!oTimeout.IsElapsed() && !bReady)
    {
        dwRes = emIoControl(dwInstanceID, EC_IOCTL_SB_RESTART, EC_NULL);
        if (EC_E_BUSY == dwRes)
        {
            OsSleep(10);
        }
        else if (EC_E_NOERROR != dwRes)
        {
            LogErr("DoBusScan(): Error 0x%x when restarting bus scan", dwRes);
            break;
        }
        else
        {
            while (!oTimeout.IsElapsed())
            {
                OsSleep(10);
                dwRes = emIoCtl(dwInstanceID, EC_IOCTL_SB_STATUS_GET, EC_NULL, 0, poStatus, sizeof(EC_T_SB_STATUS_NTFY_DESC), EC_NULL);
                if (dwRes != EC_E_NOERROR)
                {
                    LogErr("DoBusScan(): Error 0x%x getting the Bus scan status", dwRes);
                    break;
                }
                dwRes = poStatus->dwResultCode;
                if (!bWait || ((dwRes != EC_E_BUSY) && (dwRes != EC_E_NOTREADY)))
                {
                    bReady = EC_TRUE;
                    break;
                }
            }
        }
    }

    if (oTimeout.IsElapsed())
    {
        dwRes = EC_E_TIMEOUT;
    }
Exit:
    return dwRes;
}